

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<bool,_bool>::streamReconstructedExpression
          (BinaryExpr<bool,_bool> *this,ostream *os)

{
  string *in_R9;
  StringRef op;
  undefined4 *local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined2 uStack_3a;
  undefined4 *local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined1 uStack_1c;
  undefined1 uStack_1b;
  undefined2 uStack_1a;
  
  if ((this->super_ITransientExpression).field_0xa == '\x01') {
    local_20 = 0x65757274;
    local_28 = 4;
    uStack_1c = 0;
  }
  else {
    uStack_1c = 0x65;
    local_20 = 0x736c6166;
    local_28 = 5;
    uStack_1b = 0;
  }
  if (this->m_rhs == true) {
    local_40 = 0x65757274;
    local_48 = 4;
    uStack_3c = 0;
  }
  else {
    uStack_3c = 0x65;
    local_40 = 0x736c6166;
    local_48 = 5;
    uStack_3b = 0;
  }
  op.m_size = (size_type)&local_50;
  op.m_start = (char *)(this->m_op).m_size;
  local_50 = &local_40;
  local_30 = &local_20;
  formatReconstructedExpression
            ((Catch *)os,(ostream *)&local_30,(string *)(this->m_op).m_start,op,in_R9);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT26(uStack_3a,CONCAT15(uStack_3b,CONCAT14(uStack_3c,local_40))) +
                             1);
  }
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT26(uStack_1a,CONCAT15(uStack_1b,CONCAT14(uStack_1c,local_20))) +
                             1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }